

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase646::run(TestCase646 *this)

{
  WaitScope *__stat_loc;
  TransformPromiseNodeBase *pTVar1;
  _Base_ptr this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  bool returned;
  bool destroyed;
  Own<capnp::_::TestCapDestructor> local_248;
  Own<kj::_::PromiseNode> local_238;
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  request;
  Client client;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_1c8;
  undefined1 local_1b8 [56];
  Own<kj::_::PromiseNode> local_180;
  Promise<void> destructionPromise;
  PromiseFulfillerPair<void> paf;
  Maybe<capnp::MessageSize> local_140;
  TestContext context;
  
  TestContext::TestContext(&context);
  kj::newPromiseAndFulfiller<void>();
  destroyed = false;
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&paf,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:653:46),_kj::_::PropagateException>
             ::anon_class_8_1_8c041cb9_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065ccd0;
  pTVar1[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&destroyed;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  client._0_8_ = &kj::_::
                  HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_0,kj::_::PropagateException>>
                  ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  client._8_8_ = pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Promise<void>::eagerlyEvaluate(&destructionPromise,&client);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&client);
  TestContext::connect((TestContext *)&request,(int)&context,(sockaddr *)0x5,(socklen_t)in_RCX);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>(&client,(Client *)&request)
  ;
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&request);
  promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  returned = false;
  local_140.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::expectCancelRequest
            (&request,&client,&local_140);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>
            ((kj *)&local_248,&paf.fulfiller);
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            ((Client *)local_1b8,&local_248);
  capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams::Builder::setCap
            (&request.super_Builder,(Client *)local_1b8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_1b8 + 8));
  kj::Own<capnp::_::TestCapDestructor>::dispose(&local_248);
  Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
          *)local_1b8,(int)&request,__buf,in_RCX,in_R8D);
  this_00 = (_Base_ptr)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            ((TransformPromiseNodeBase *)this_00,(Own<kj::_::PromiseNode> *)local_1b8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:665:9),_kj::_::PropagateException>
             ::anon_class_8_1_d59fe34d_for_func::operator());
  *(undefined ***)this_00 = &PTR_onReady_0065cd58;
  *(bool **)(this_00 + 1) = &returned;
  local_248.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase646::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase646::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_248.ptr = (TestCapDestructor *)0x0;
  local_1c8.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>,capnp::_::(anonymous_namespace)::TestCase646::run()::$_1,kj::_::PropagateException>>
        ::instance;
  local_238.ptr = (PromiseNode *)0x0;
  local_1c8.ptr = (PromiseNode *)this_00;
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::eagerlyEvaluate((Promise<void> *)&local_180,&local_1c8);
  kj::Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_180);
  kj::Own<kj::_::PromiseNode>::dispose(&local_180);
  kj::Own<kj::_::PromiseNode>::dispose(&local_1c8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults> *)
             local_1b8);
  kj::Own<capnp::RequestHook>::dispose(&request.hook);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:669:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065cde0;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_2,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_2,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  __stat_loc = &context.waitScope;
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:670:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065ce68;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_3,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_3,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_3,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:671:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065cef0;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_4,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_4,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_4,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:672:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065cf78;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_5,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_5,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_5,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:673:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065d000;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_6,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_6,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_6,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  kj::_::yield();
  pTVar1 = (TransformPromiseNodeBase *)operator_new(0x28);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar1,(Own<kj::_::PromiseNode> *)&local_248,
             kj::_::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:674:17),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065d088;
  request.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_7,kj::_::PropagateException>>
        ::instance;
  local_1b8._0_8_ =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_7,kj::_::PropagateException>>
        ::instance;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  local_238.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,capnp::_::(anonymous_namespace)::TestCase646::run()::$_7,kj::_::PropagateException>>
        ::instance;
  local_1b8._8_8_ = (PromiseNode *)0x0;
  local_238.ptr = (PromiseNode *)pTVar1;
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1b8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_248);
  kj::Promise<void>::wait((Promise<void> *)&local_238,__stat_loc);
  kj::Own<kj::_::PromiseNode>::dispose(&local_238);
  if ((destroyed & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[30]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a5,ERROR,"\"failed: expected \" \"!(destroyed)\"",
               (char (*) [30])"failed: expected !(destroyed)");
  }
  if ((returned == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2a6,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  request.super_Builder._builder.segment = (SegmentBuilder *)0x0;
  request.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  kj::Own<kj::_::PromiseNode>::operator=
            ((Own<kj::_::PromiseNode> *)&promise,(Own<kj::_::PromiseNode> *)&request);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&request);
  kj::Promise<void>::wait(&destructionPromise,__stat_loc);
  if (kj::_::Debug::minSeverity < 3 && destroyed == false) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ab,ERROR,"\"failed: expected \" \"destroyed\"",
               (char (*) [27])"failed: expected destroyed");
  }
  if ((returned == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x2ac,ERROR,"\"failed: expected \" \"!(returned)\"",
               (char (*) [29])"failed: expected !(returned)");
  }
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&destructionPromise);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair(&paf);
  TestContext::~TestContext(&context);
  return;
}

Assistant:

TEST(Rpc, Cancelation) {
  // Tests allowCancellation().

  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
      .castAs<test::TestMoreStuff>();

  kj::Promise<void> promise = nullptr;

  bool returned = false;
  {
    auto request = client.expectCancelRequest();
    request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
    promise = request.send().then(
        [&](Response<test::TestMoreStuff::ExpectCancelResults>&& response) {
      returned = true;
    }).eagerlyEvaluate(nullptr);
  }
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);
  kj::evalLater([]() {}).wait(context.waitScope);

  // We can detect that the method was canceled because it will drop the cap.
  EXPECT_FALSE(destroyed);
  EXPECT_FALSE(returned);

  promise = nullptr;  // request cancellation
  destructionPromise.wait(context.waitScope);

  EXPECT_TRUE(destroyed);
  EXPECT_FALSE(returned);
}